

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LLVMDataDependenceAnalysis.cpp
# Opt level: O0

vector<llvm::Value_*,_std::allocator<llvm::Value_*>_> * __thiscall
dg::dda::LLVMDataDependenceAnalysis::getLLVMDefinitions(LLVMDataDependenceAnalysis *this,Value *use)

{
  bool bVar1;
  raw_ostream *in_RSI;
  RWNode *in_RDI;
  Value *llvmvalue;
  RWNode *nd;
  iterator __end2;
  iterator __begin2;
  vector<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_> *__range2;
  vector<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_> rdDefs;
  RWNode *loc;
  vector<llvm::Value_*,_std::allocator<llvm::Value_*>_> *defs;
  RWNode *in_stack_ffffffffffffff68;
  RWNode *this_00;
  __normal_iterator<dg::dda::RWNode_**,_std::vector<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>_>
  local_58;
  undefined1 *local_50;
  undefined1 local_48 [28];
  undefined4 local_2c;
  RWNode *local_28;
  byte local_19;
  
  local_19 = 0;
  this_00 = in_RDI;
  std::vector<llvm::Value_*,_std::allocator<llvm::Value_*>_>::vector
            ((vector<llvm::Value_*,_std::allocator<llvm::Value_*>_> *)0x1a4f43);
  local_28 = getNode((LLVMDataDependenceAnalysis *)in_RDI,(Value *)in_stack_ffffffffffffff68);
  if (local_28 == (RWNode *)0x0) {
    llvm::errs();
    llvm::raw_ostream::operator<<(in_RSI,(char *)this_00);
    llvm::operator<<((raw_ostream *)in_RDI,(Value *)in_stack_ffffffffffffff68);
    llvm::raw_ostream::operator<<(in_RSI,(char *)this_00);
    local_19 = 1;
    local_2c = 1;
  }
  else {
    RWNode::getUses((RWNode *)0x1a4fb1);
    bVar1 = std::
            set<dg::dda::GenericDefSite<dg::dda::RWNode>,_std::less<dg::dda::GenericDefSite<dg::dda::RWNode>_>,_std::allocator<dg::dda::GenericDefSite<dg::dda::RWNode>_>_>
            ::empty((set<dg::dda::GenericDefSite<dg::dda::RWNode>,_std::less<dg::dda::GenericDefSite<dg::dda::RWNode>_>,_std::allocator<dg::dda::GenericDefSite<dg::dda::RWNode>_>_>
                     *)0x1a4fb9);
    if (bVar1) {
      llvm::errs();
      llvm::raw_ostream::operator<<(in_RSI,(char *)this_00);
      llvm::operator<<((raw_ostream *)in_RDI,(Value *)in_stack_ffffffffffffff68);
      llvm::raw_ostream::operator<<(in_RSI,(char *)this_00);
      local_19 = 1;
      local_2c = 1;
    }
    else {
      bVar1 = llvm::isa<llvm::LoadInst,llvm::Value*>((Value **)0x1a5011);
      if (!bVar1) {
        bVar1 = llvm::isa<llvm::CallInst,llvm::Value*>((Value **)0x1a5022);
        if (!bVar1) {
          llvm::errs();
          llvm::raw_ostream::operator<<(in_RSI,(char *)this_00);
          llvm::operator<<((raw_ostream *)in_RDI,(Value *)in_stack_ffffffffffffff68);
          llvm::raw_ostream::operator<<(in_RSI,(char *)this_00);
        }
      }
      getDefinitions((LLVMDataDependenceAnalysis *)this_00,in_RDI);
      local_50 = local_48;
      local_58._M_current =
           (RWNode **)
           std::vector<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>::begin
                     ((vector<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_> *)
                      in_stack_ffffffffffffff68);
      std::vector<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>::end
                ((vector<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_> *)
                 in_stack_ffffffffffffff68);
      while( true ) {
        bVar1 = __gnu_cxx::operator!=
                          ((__normal_iterator<dg::dda::RWNode_**,_std::vector<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>_>
                            *)in_RDI,
                           (__normal_iterator<dg::dda::RWNode_**,_std::vector<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>_>
                            *)in_stack_ffffffffffffff68);
        if (!bVar1) break;
        __gnu_cxx::
        __normal_iterator<dg::dda::RWNode_**,_std::vector<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>_>
        ::operator*(&local_58);
        getValue((LLVMDataDependenceAnalysis *)in_RDI,in_stack_ffffffffffffff68);
        std::vector<llvm::Value_*,_std::allocator<llvm::Value_*>_>::push_back
                  ((vector<llvm::Value_*,_std::allocator<llvm::Value_*>_> *)in_RDI,
                   (value_type *)in_stack_ffffffffffffff68);
        __gnu_cxx::
        __normal_iterator<dg::dda::RWNode_**,_std::vector<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>_>
        ::operator++(&local_58);
      }
      local_19 = 1;
      local_2c = 1;
      std::vector<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>::~vector
                ((vector<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_> *)in_RSI);
    }
  }
  if ((local_19 & 1) == 0) {
    std::vector<llvm::Value_*,_std::allocator<llvm::Value_*>_>::~vector
              ((vector<llvm::Value_*,_std::allocator<llvm::Value_*>_> *)in_RSI);
  }
  return (vector<llvm::Value_*,_std::allocator<llvm::Value_*>_> *)this_00;
}

Assistant:

std::vector<llvm::Value *>
LLVMDataDependenceAnalysis::getLLVMDefinitions(llvm::Value *use) {
    std::vector<llvm::Value *> defs;

    auto *loc = getNode(use);
    if (!loc) {
        llvm::errs() << "[DDA] error: no node for: " << *use << "\n";
        return defs;
    }

    if (loc->getUses().empty()) {
        llvm::errs() << "[DDA] error: the queried value has empty uses: "
                     << *use << "\n";
        return defs;
    }

    if (!llvm::isa<llvm::LoadInst>(use) && !llvm::isa<llvm::CallInst>(use)) {
        llvm::errs() << "[DDA] error: the queried value is not a use: " << *use
                     << "\n";
    }

    auto rdDefs = getDefinitions(loc);
#ifndef NDEBUG
    if (rdDefs.empty()) {
        if (!loc->usesOnlyGlobals()) {
            static std::set<const llvm::Value *> reported;
            if (reported.insert(use).second) {
                llvm::errs()
                        << "[DDA] warn: no definitions for: " << *use << "\n";
            }
        }
    }
#endif // NDEBUG

    // map the values
    for (RWNode *nd : rdDefs) {
        assert(nd->getType() != RWNodeType::PHI);
        const auto *llvmvalue = getValue(nd);
        assert(llvmvalue && "Have no value for a node");
        defs.push_back(const_cast<llvm::Value *>(llvmvalue));
    }

    return defs;
}